

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_epoll.h
# Opt level: O0

int sp_add(int efd,int sock,void *ud)

{
  int iVar1;
  undefined1 local_2c [8];
  epoll_event ev;
  void *ud_local;
  int sock_local;
  int efd_local;
  
  local_2c._0_4_ = 1;
  unique0x1000002e = ud;
  ev.data.ptr = ud;
  iVar1 = epoll_ctl(efd,1,sock,(epoll_event *)local_2c);
  sock_local = (int)(iVar1 == -1);
  return sock_local;
}

Assistant:

static int 
sp_add(int efd, int sock, void *ud) {
	struct epoll_event ev;
	ev.events = EPOLLIN;
	ev.data.ptr = ud;
	if (epoll_ctl(efd, EPOLL_CTL_ADD, sock, &ev) == -1) {
		return 1;
	}
	return 0;
}